

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O1

PyObject * libxml_xmlRelaxNGInitTypes(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  
  iVar1 = libxml_deprecationWarning("xmlRelaxNGInitTypes");
  if (iVar1 != -1) {
    iVar1 = xmlRelaxNGInitTypes();
    pPVar2 = libxml_intWrap(iVar1);
    return pPVar2;
  }
  return (PyObject *)0x0;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlRelaxNGInitTypes(PyObject *self ATTRIBUTE_UNUSED, PyObject *args ATTRIBUTE_UNUSED) {
    PyObject *py_retval;
    int c_retval;

    if (libxml_deprecationWarning("xmlRelaxNGInitTypes") == -1)
        return(NULL);

    c_retval = xmlRelaxNGInitTypes();
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}